

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::Test::HasFatalFailure(void)

{
  long lVar1;
  pointer pTVar2;
  uint uVar3;
  TestResult *pTVar4;
  pointer pTVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UnitTest::GetInstance();
  if ((UnitTest::GetInstance::instance.impl_)->current_test_info_ == (TestInfo *)0x0) {
    if ((UnitTest::GetInstance::instance.impl_)->current_test_case_ == (TestCase *)0x0) {
      pTVar4 = &(UnitTest::GetInstance::instance.impl_)->ad_hoc_test_result_;
    }
    else {
      pTVar4 = &(UnitTest::GetInstance::instance.impl_)->current_test_case_->ad_hoc_test_result_;
    }
  }
  else {
    pTVar4 = &(UnitTest::GetInstance::instance.impl_)->current_test_info_->result_;
  }
  pTVar5 = (pTVar4->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (pTVar4->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  if (pTVar5 != pTVar2) {
    do {
      uVar3 = uVar3 + (pTVar5->type_ == kFatalFailure);
      pTVar5 = pTVar5 + 1;
    } while (pTVar5 != pTVar2);
    uVar3 = (uint)(uVar3 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SUB41(uVar3,0);
  }
  __stack_chk_fail();
}

Assistant:

bool Test::HasFatalFailure() {
  return internal::GetUnitTestImpl()->current_test_result()->HasFatalFailure();
}